

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseDeclarationOrFunctionDefinition_AtDeclarator
          (Parser *this,DeclarationSyntax **decl,SpecifierListSyntax *specList)

{
  DeclaratorListSyntax *pDVar1;
  SpecifierListSyntax *specList_00;
  bool bVar2;
  SyntaxKind SVar3;
  SyntaxKind SVar4;
  int iVar5;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar6;
  SyntaxToken *pSVar7;
  SyntaxNode *pSVar8;
  long lVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IndexType IVar10;
  ostream *poVar11;
  VariableAndOrFunctionDeclarationSyntax *pVVar12;
  InitializerSyntax **init;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar13;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> **ppSVar14;
  DeclaratorSyntax *decltor;
  SpecifierListSyntax *local_b0;
  DeclaratorListSyntax *decltorList;
  ExtKR_ParameterDeclarationListSyntax *paramKRList;
  Backtracker BT;
  undefined4 extraout_var;
  
  ppSVar14 = &decltorList;
  decltorList = (DeclaratorListSyntax *)0x0;
  local_b0 = specList;
  do {
    decltor = (DeclaratorSyntax *)0x0;
    bVar2 = parseDeclarator(this,&decltor,Unspecified);
    if (!bVar2) {
      return false;
    }
    pSVar6 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                       (this,&decltor);
    *ppSVar14 = pSVar6;
    pSVar7 = peek(this,1);
    SVar4 = pSVar7->syntaxK_;
    if (SVar4 == EqualsToken) {
      pSVar8 = &SyntaxUtilities::unparenthesizeDeclarator(decltor)->super_SyntaxNode;
      SVar3 = C::SyntaxNode::kind(pSVar8);
      switch(SVar3) {
      case PointerDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x4e])(pSVar8);
        lVar9 = CONCAT44(extraout_var,iVar5);
        break;
      case IdentifierDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x50])(pSVar8);
        IVar10 = consume(this);
        *(IndexType *)(CONCAT44(extraout_var_00,iVar5) + 0x30) = IVar10;
        init = (InitializerSyntax **)(CONCAT44(extraout_var_00,iVar5) + 0x38);
        goto LAB_002e79c5;
      default:
switchD_002e793d_caseD_413:
        DiagnosticsReporter::UnexpectedInitializerOfDeclarator(&this->diagReporter_);
        bVar2 = ignoreDeclarator(this);
        return bVar2;
      case ArrayDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x56])(pSVar8);
        lVar9 = CONCAT44(extraout_var_02,iVar5);
        break;
      case FunctionDeclarator:
        iVar5 = (*(pSVar8->super_Managed)._vptr_Managed[0x56])(pSVar8);
        lVar9 = CONCAT44(extraout_var_01,iVar5);
        if (*(DeclaratorSyntax **)(lVar9 + 0x20) == (DeclaratorSyntax *)0x0)
        goto switchD_002e793d_caseD_413;
        pSVar8 = &SyntaxUtilities::unparenthesizeDeclarator(*(DeclaratorSyntax **)(lVar9 + 0x20))->
                  super_SyntaxNode;
        SVar3 = C::SyntaxNode::kind(pSVar8);
        if (SVar3 != PointerDeclarator) goto switchD_002e793d_caseD_413;
      }
      IVar10 = consume(this);
      *(IndexType *)(lVar9 + 0x38) = IVar10;
      init = (InitializerSyntax **)(lVar9 + 0x40);
LAB_002e79c5:
      bVar2 = parseInitializer(this,init);
      if (!bVar2) {
        return false;
      }
    }
    pSVar7 = peek(this,1);
    specList_00 = local_b0;
    SVar3 = pSVar7->syntaxK_;
    if (SVar3 != CommaToken) {
      if (SVar3 == OpenBraceToken) {
        bVar2 = parseFunctionDefinition_AtOpenBrace
                          (this,decl,local_b0,&decltor,(ExtKR_ParameterDeclarationListSyntax *)0x0);
        if (bVar2) {
          return true;
        }
      }
      else {
        pSVar13 = local_b0;
        if (SVar3 == SemicolonToken) break;
      }
      if (SVar4 == EqualsToken) {
        DiagnosticsReporter::ExpectedFollowOfDeclaratorAndInitializer(&this->diagReporter_);
        return false;
      }
      Backtracker::Backtracker(&BT,this,0);
      paramKRList = (ExtKR_ParameterDeclarationListSyntax *)0x0;
      bVar2 = parseExtKR_ParameterDeclarationList(this,&paramKRList);
      if (bVar2) {
        Backtracker::discard(&BT);
        bVar2 = parseFunctionDefinition_AtOpenBrace(this,decl,specList_00,&decltor,paramKRList);
        if (bVar2) {
          std::
          vector<std::pair<psy::DiagnosticDescriptor,_unsigned_long>,_std::allocator<std::pair<psy::DiagnosticDescriptor,_unsigned_long>_>_>
          ::clear(&(this->diagReporter_).delayedDiags_);
          bVar2 = true;
          goto LAB_002e7b0f;
        }
      }
      else {
        Backtracker::backtrack(&BT);
        DiagnosticsReporter::ExpectedFollowOfDeclarator(&this->diagReporter_);
      }
      bVar2 = false;
LAB_002e7b0f:
      Backtracker::~Backtracker(&BT);
      return bVar2;
    }
    IVar10 = consume(this);
    pDVar1 = *ppSVar14;
    pDVar1->delimTkIdx_ = (uint)IVar10;
    ppSVar14 = &(pDVar1->
                super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                ).
                super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                .next;
  } while( true );
LAB_002e7a15:
  if (pSVar13 == (SpecifierListSyntax *)0x0) {
    pVVar12 = makeNode<psy::C::VariableAndOrFunctionDeclarationSyntax>(this);
LAB_002e7b99:
    *decl = (DeclarationSyntax *)pVVar12;
    IVar10 = consume(this);
    pVVar12->semicolonTkIdx_ = IVar10;
    pVVar12->specs_ = specList_00;
    pVVar12->decltors_ = decltorList;
    return true;
  }
  pSVar8 = &((pSVar13->
             super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             ).
             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
            .value)->super_SyntaxNode;
  if (pSVar8 == (SyntaxNode *)0x0) {
    poVar11 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x143);
    poVar11 = std::operator<<(poVar11," ");
    poVar11 = std::operator<<(poVar11,"<empty message>");
    std::endl<char,std::char_traits<char>>(poVar11);
    return false;
  }
  SVar4 = C::SyntaxNode::kind(pSVar8);
  if (SVar4 == TypedefStorageClass) {
    pVVar12 = (VariableAndOrFunctionDeclarationSyntax *)
              makeNode<psy::C::TypedefDeclarationSyntax>(this);
    goto LAB_002e7b99;
  }
  pSVar13 = (pSVar13->
            super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
            ).
            super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
            .next;
  goto LAB_002e7a15;
}

Assistant:

bool Parser::parseDeclarationOrFunctionDefinition_AtDeclarator(
        DeclarationSyntax*& decl,
        const SpecifierListSyntax* specList)
{
    DeclaratorListSyntax* decltorList = nullptr;
    DeclaratorListSyntax** decltorList_cur = &decltorList;

    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Unspecified))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);

        InitializerSyntax** init = nullptr;
        if (peek().kind() == SyntaxKind::EqualsToken) {
            DeclaratorSyntax* unparenDecltor = const_cast<DeclaratorSyntax*>(
                    SyntaxUtilities::unparenthesizeDeclarator(decltor));
            switch (unparenDecltor->kind()) {
                case SyntaxKind::IdentifierDeclarator: {
                    auto identDecltor = unparenDecltor->asIdentifierDeclarator();
                    identDecltor->equalsTkIdx_ = consume();
                    init = &identDecltor->init_;
                    break;
                }

                case SyntaxKind::PointerDeclarator: {
                    auto ptrDecltor = unparenDecltor->asPointerDeclarator();
                    ptrDecltor->equalsTkIdx_ = consume();
                    init = &ptrDecltor->init_;
                    break;
                }

                case SyntaxKind::ArrayDeclarator: {
                    auto arrDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    arrDecltor->equalsTkIdx_ = consume();
                    init = &arrDecltor->init_;
                    break;
                }

                case SyntaxKind::FunctionDeclarator: {
                    auto funcDecltor = unparenDecltor->asArrayOrFunctionDeclarator();
                    if (funcDecltor->innerDecltor_) {
                        auto unparenInnerDecltor = const_cast<DeclaratorSyntax*>(
                                    SyntaxUtilities::unparenthesizeDeclarator(funcDecltor->innerDecltor_));
                        if (unparenInnerDecltor->kind() == SyntaxKind::PointerDeclarator) {
                            funcDecltor->equalsTkIdx_ = consume();
                            init = &funcDecltor->init_;
                            break;
                        }
                    }
                    [[fallthrough]];
                }

                default:
                    diagReporter_.UnexpectedInitializerOfDeclarator();
                    return ignoreDeclarator();
            }
            if (!parseInitializer(*init))
                return false;
        }

        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                break;

            case SyntaxKind::SemicolonToken: {
                for (auto iter = specList; iter; iter = iter->next) {
                    PSY_ASSERT_2(iter->value, return false);
                    if (iter->value->kind() == SyntaxKind::TypedefStorageClass) {
                        auto tydefDecl = makeNode<TypedefDeclarationSyntax>();
                        decl = tydefDecl;
                        tydefDecl->semicolonTkIdx_ = consume();
                        tydefDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                        tydefDecl->decltors_ = decltorList;
                        return true;
                    }
                }

                auto varAndOrFuncDecl = makeNode<VariableAndOrFunctionDeclarationSyntax>();
                decl = varAndOrFuncDecl;
                varAndOrFuncDecl->semicolonTkIdx_ = consume();
                varAndOrFuncDecl->specs_ = const_cast<SpecifierListSyntax*>(specList);
                varAndOrFuncDecl->decltors_ = decltorList;
                return true;
            }

            case SyntaxKind::OpenBraceToken:
                if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, nullptr))
                    return true;
                [[fallthrough]];

            default: {
                if (init) {
                    diagReporter_.ExpectedFollowOfDeclaratorAndInitializer();
                    return false;
                }

                Backtracker BT(this);
                ExtKR_ParameterDeclarationListSyntax* paramKRList = nullptr;
                if (parseExtKR_ParameterDeclarationList(paramKRList)) {
                    BT.discard();
                    if (parseFunctionDefinition_AtOpenBrace(decl, specList, decltor, paramKRList)) {
                        diagReporter_.delayedDiags_.clear();
                        return true;
                    }
                    return false;
                }
                BT.backtrack();

                diagReporter_.ExpectedFollowOfDeclarator();
                return false;
            }
        }

        decltorList_cur = &(*decltorList_cur)->next;
    }
}